

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicAPIBind::Run(BasicAPIBind *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  GLuint index;
  uint uVar5;
  byte bVar6;
  GLint name;
  GLuint *local_38;
  
  bVar6 = 1;
  uVar5 = 0;
  do {
    bVar1 = ShaderImageLoadStoreBase::CheckBinding
                      (&this->super_ShaderImageLoadStoreBase,uVar5,0,0,'\0',0,35000,0x8236);
    if (!bVar1) {
      bVar6 = 0;
      anon_unknown_0::Output("Binding point %d has invalid default state.\n",(ulong)uVar5);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  local_38 = &this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,1,local_38);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->m_texture);
  glu::CallLogWrapper::glTexStorage3D(this_00,0x8c1a,4,0x8230,0x10,0x10,4);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture,0,'\0',0,0x88ba,0x822e);
  bVar1 = ShaderImageLoadStoreBase::CheckBinding
                    (&this->super_ShaderImageLoadStoreBase,0,this->m_texture,0,'\0',0,0x88ba,0x822e)
  ;
  glu::CallLogWrapper::glBindImageTexture(this_00,3,this->m_texture,1,'\x01',1,0x88b9,0x8058);
  bVar2 = ShaderImageLoadStoreBase::CheckBinding
                    (&this->super_ShaderImageLoadStoreBase,3,this->m_texture,1,'\x01',1,0x88b9,
                     0x8058);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture,3,'\0',2,0x88ba,0x8d7c);
  bVar3 = ShaderImageLoadStoreBase::CheckBinding
                    (&this->super_ShaderImageLoadStoreBase,1,this->m_texture,3,'\0',2,0x88ba,0x8d7c)
  ;
  glu::CallLogWrapper::glBindImageTexture(this_00,2,this->m_texture,4,'\0',3,35000,0x8235);
  bVar4 = ShaderImageLoadStoreBase::CheckBinding
                    (&this->super_ShaderImageLoadStoreBase,2,this->m_texture,4,'\0',3,35000,0x8235);
  if (!bVar4) {
    bVar6 = 0;
  }
  if (!bVar3) {
    bVar6 = 0;
  }
  if (!bVar2) {
    bVar6 = 0;
  }
  if (!bVar1) {
    bVar6 = 0;
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,1,local_38);
  this->m_texture = 0;
  uVar5 = 0;
  do {
    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8f3a,uVar5,&name);
    if (name != 0) {
      bVar6 = 0;
      anon_unknown_0::Output
                ("Binding point %d should be set to 0 after texture deletion.\n",(ulong)uVar5);
    }
    bVar1 = ShaderImageLoadStoreBase::CheckBinding
                      (&this->super_ShaderImageLoadStoreBase,uVar5,0,0,'\0',0,35000,0x8236);
    if (!bVar1) {
      bVar6 = 0;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  return -(ulong)(~bVar6 & 1);
}

Assistant:

virtual long Run()
	{
		bool status = true;
		for (GLuint index = 0; index < 4; ++index)
		{
			if (!CheckBinding(index, 0, 0, GL_FALSE, 0, GL_READ_ONLY, GL_R32UI))
			{
				Output("Binding point %d has invalid default state.\n", index);
				status = false;
			}
		}

		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexStorage3D(GL_TEXTURE_2D_ARRAY, 4, GL_RG32F, 16, 16, 4);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32F);
		if (!CheckBinding(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32F))
			status = false;

		glBindImageTexture(3, m_texture, 1, GL_TRUE, 1, GL_WRITE_ONLY, GL_RGBA8);
		if (!CheckBinding(3, m_texture, 1, GL_TRUE, 1, GL_WRITE_ONLY, GL_RGBA8))
			status = false;

		glBindImageTexture(1, m_texture, 3, GL_FALSE, 2, GL_READ_WRITE, GL_RGBA8UI);
		if (!CheckBinding(1, m_texture, 3, GL_FALSE, 2, GL_READ_WRITE, GL_RGBA8UI))
			status = false;

		glBindImageTexture(2, m_texture, 4, GL_FALSE, 3, GL_READ_ONLY, GL_R32I);
		if (!CheckBinding(2, m_texture, 4, GL_FALSE, 3, GL_READ_ONLY, GL_R32I))
			status = false;

		glDeleteTextures(1, &m_texture);
		m_texture = 0;

		for (GLuint index = 0; index < 4; ++index)
		{
			GLint name;
			glGetIntegeri_v(GL_IMAGE_BINDING_NAME, index, &name);
			if (name != 0)
			{
				Output("Binding point %d should be set to 0 after texture deletion.\n", index);
				status = false;
			}
			if (!CheckBinding(index, 0, 0, GL_FALSE, 0, GL_READ_ONLY, GL_R32UI))
				status = false;
		}

		return status ? NO_ERROR : ERROR;
	}